

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O2

bool re2::StringPiece::_equal(StringPiece *x,StringPiece *y)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  
  iVar1 = x->length_;
  if (iVar1 == y->length_) {
    pcVar3 = x->ptr_;
    pcVar4 = y->ptr_;
    if ((iVar1 < 1) || (pcVar3[iVar1 - 1U] == pcVar4[iVar1 - 1U])) {
      pcVar2 = pcVar3 + iVar1;
      while( true ) {
        bVar5 = pcVar2 <= pcVar3;
        if (bVar5) {
          return bVar5;
        }
        if (*pcVar3 != *pcVar4) break;
        pcVar3 = pcVar3 + 1;
        pcVar4 = pcVar4 + 1;
      }
      return bVar5;
    }
  }
  return false;
}

Assistant:

const char* data() const { return ptr_; }